

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::InlinePass::HasNoReturnInLoop(InlinePass *this,Function *func)

{
  IRContext *pIVar1;
  pointer puVar2;
  pointer puVar3;
  StructuredCFGAnalysis *this_00;
  BasicBlock *pBVar4;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_01;
  bool bVar5;
  byte bVar6;
  uint32_t uVar7;
  byte bVar8;
  pointer puVar9;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
  }
  bVar5 = EnumSet<spv::Capability>::contains
                    (&((pIVar1->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,CapabilityShader);
  if (bVar5) {
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
      IRContext::BuildStructuredCFGAnalysis(pIVar1);
    }
    puVar2 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 == puVar3) {
      bVar5 = true;
    }
    else {
      this_00 = (pIVar1->struct_cfg_analysis_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
      bVar8 = 0;
      do {
        puVar9 = puVar2 + 1;
        pBVar4 = (puVar2->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        bVar5 = spvOpcodeIsReturn((*(Instruction **)
                                    ((long)&(pBVar4->insts_).
                                            super_IntrusiveList<spvtools::opt::Instruction> + 0x18))
                                  ->opcode_);
        if (bVar5) {
          this_01.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               (pBVar4->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ;
          uVar7 = 0;
          if (*(bool *)((long)this_01.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 0x2d) == true) {
            uVar7 = Instruction::GetSingleWordOperand
                              ((Instruction *)
                               this_01.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl,
                               (uint)*(bool *)((long)this_01.
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
          }
          uVar7 = StructuredCFGAnalysis::ContainingLoop(this_00,uVar7);
          bVar5 = true;
          bVar6 = 1;
          if (uVar7 == 0) goto LAB_005ca17d;
        }
        else {
LAB_005ca17d:
          bVar5 = false;
          bVar6 = bVar8;
        }
      } while ((!bVar5) && (puVar2 = puVar9, bVar8 = bVar6, puVar9 != puVar3));
      bVar5 = (bool)(bVar6 ^ 1);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool InlinePass::HasNoReturnInLoop(Function* func) {
  // If control not structured, do not do loop/return analysis
  // TODO: Analyze returns in non-structured control flow
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return false;
  const auto structured_analysis = context()->GetStructuredCFGAnalysis();
  // Search for returns in structured construct.
  bool return_in_loop = false;
  for (auto& blk : *func) {
    auto terminal_ii = blk.cend();
    --terminal_ii;
    if (spvOpcodeIsReturn(terminal_ii->opcode()) &&
        structured_analysis->ContainingLoop(blk.id()) != 0) {
      return_in_loop = true;
      break;
    }
  }
  return !return_in_loop;
}